

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

_Bool sell_stat(wchar_t choice,int *stats_local,int *points_spent_local,int *points_inc_local,
               int *points_left_local,_Bool update_display)

{
  int iVar1;
  int iVar2;
  undefined1 extraout_AL;
  ulong in_RAX;
  wchar_t points_left_local_00;
  
  if ((uint)choice < 5) {
    in_RAX = (ulong)(uint)choice;
    iVar1 = stats[in_RAX];
    if (10 < (long)iVar1) {
      iVar2 = birth_stat_costs[iVar1];
      points_spent[in_RAX] = points_spent[in_RAX] - iVar2;
      stats[in_RAX] = iVar1 + -1;
      points_inc[in_RAX] = iVar2;
      points_left = iVar2 + points_left;
      if ((char)stats_local != '\0') {
        points_left_local_00 = L'\x00296880';
        event_signal_birthpoints(points_spent,points_inc,points_left);
        recalculate_stats((int *)(ulong)(uint)points_left,points_left_local_00);
        return (_Bool)extraout_AL;
      }
    }
  }
  return SUB81(in_RAX,0);
}

Assistant:

static bool sell_stat(int choice, int stats_local[STAT_MAX],
	int points_spent_local[STAT_MAX],
	int points_inc_local[STAT_MAX],
	int *points_left_local, bool update_display)
{
	/* Must be a valid stat, and we can't "sell" stats below the base of 10. */
	if (!(choice >= STAT_MAX || choice < 0) && (stats_local[choice] > 10)) {
		int stat_cost = birth_stat_costs[stats_local[choice]];

		stats_local[choice]--;
		points_spent_local[choice] -= stat_cost;
		points_inc_local[choice] =
			birth_stat_costs[stats_local[choice] + 1];
		*points_left_local += stat_cost;

		if (update_display) {
			/* Tell the UI the new points situation. */
			event_signal_birthpoints(points_spent_local,
				points_inc_local, *points_left_local);

			/* Recalculate everything that's changed because
			   the stat has changed, and inform the UI. */
			recalculate_stats(stats_local, *points_left_local);
		}

		return true;
	}

	/* Didn't adjust stat. */
	return false;
}